

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::SubroutineIndexNegativeLinkMaxIndex::Run
          (SubroutineIndexNegativeLinkMaxIndex *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  Loc _location;
  Index _index;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  GLint max;
  SubroutineFunctionSet functions_st0;
  undefined1 local_180 [24];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [2];
  pointer local_130;
  pointer local_120;
  undefined1 local_110 [216];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8de7,&max);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,0);
  _index.super_LayoutSpecifierBase.numSys = Dec;
  _index.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
  _index.super_LayoutSpecifierBase.val = max;
  SubroutineFunction::SubroutineFunction((SubroutineFunction *)local_180,generator,_index);
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)local_180);
  if ((undefined1 *)local_110._120_8_ != local_110 + 0x88) {
    operator_delete((void *)local_110._120_8_,local_110._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_180 + 0x10));
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _location.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
  _location.super_LayoutSpecifierBase.val = 1999999;
  _location.super_LayoutSpecifierBase.numSys = Dec;
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_180,generator,&functions_st0,_location,0,(DefOccurence)0x2,
             true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  UniformValue::~UniformValue((UniformValue *)local_110);
  if (local_130 != (pointer)0x0) {
    operator_delete(local_130,(long)local_120 - (long)local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != local_158) {
    operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_180);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st0.typeName._M_dataplus._M_p != &functions_st0.typeName.field_2) {
    operator_delete(functions_st0.typeName._M_dataplus._M_p,
                    functions_st0.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st0.fn);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINES, &max);

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = N) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(max)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}